

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_msg.c
# Opt level: O2

int mbedtls_ssl_finish_handshake_msg(mbedtls_ssl_context *ssl,size_t buf_len,size_t msg_len)

{
  int iVar1;
  
  ssl->out_msglen = msg_len + 4;
  iVar1 = mbedtls_ssl_write_handshake_msg_ext(ssl,0,0);
  return iVar1;
}

Assistant:

int mbedtls_ssl_finish_handshake_msg(mbedtls_ssl_context *ssl,
                                     size_t buf_len, size_t msg_len)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t msg_with_header_len;
    ((void) buf_len);

    /* Add reserved 4 bytes for handshake header */
    msg_with_header_len = msg_len + 4;
    ssl->out_msglen = msg_with_header_len;
    MBEDTLS_SSL_PROC_CHK(mbedtls_ssl_write_handshake_msg_ext(ssl, 0, 0));

cleanup:
    return ret;
}